

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedLinearAllocator.hpp
# Opt level: O0

void __thiscall Diligent::FixedLinearAllocator::Reset(FixedLinearAllocator *this)

{
  FixedLinearAllocator *this_local;
  
  this->m_pDataStart = (uint8_t *)0x0;
  this->m_pCurrPtr = (uint8_t *)0x0;
  this->m_ReservedSize = 0;
  this->m_CurrAlignment = 0;
  this->m_pAllocator = (IMemoryAllocator *)0x0;
  this->m_DbgCurrAllocation = 0;
  std::
  vector<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
  ::clear(&this->m_DbgAllocations);
  this->m_DbgUsingExternalMemory = false;
  return;
}

Assistant:

void Reset()
    {
        m_pDataStart    = nullptr;
        m_pCurrPtr      = nullptr;
        m_ReservedSize  = 0;
        m_CurrAlignment = 0;
        m_pAllocator    = nullptr;

#if DILIGENT_DEBUG
        m_DbgCurrAllocation = 0;
        m_DbgAllocations.clear();
        m_DbgUsingExternalMemory = false;
#endif
    }